

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ResizeBilinearLayerParams::InternalSwap
          (ResizeBilinearLayerParams *this,ResizeBilinearLayerParams *other)

{
  intptr_t iVar1;
  SamplingMode *pSVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar1;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    other_00 = google::protobuf::internal::LogMessage::operator<<
                         (&local_50,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other_00);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar6 = (this->targetsize_).current_size_;
  iVar7 = (this->targetsize_).total_size_;
  pvVar3 = (this->targetsize_).arena_or_elements_;
  iVar5 = (other->targetsize_).total_size_;
  pvVar4 = (other->targetsize_).arena_or_elements_;
  (this->targetsize_).current_size_ = (other->targetsize_).current_size_;
  (this->targetsize_).total_size_ = iVar5;
  (this->targetsize_).arena_or_elements_ = pvVar4;
  (other->targetsize_).current_size_ = iVar6;
  (other->targetsize_).total_size_ = iVar7;
  (other->targetsize_).arena_or_elements_ = pvVar3;
  pSVar2 = this->mode_;
  this->mode_ = other->mode_;
  other->mode_ = pSVar2;
  return;
}

Assistant:

void ResizeBilinearLayerParams::InternalSwap(ResizeBilinearLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  targetsize_.InternalSwap(&other->targetsize_);
  swap(mode_, other->mode_);
}